

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::iterateShaders
               (NegativeTestContext *ctx,TestCase testCase)

{
  ShaderType shaderType_;
  NegativeTestContext *pNVar1;
  bool bVar2;
  char *__rhs;
  RenderContext *renderCtx;
  ProgramSources *sources;
  ShaderInfo *pSVar3;
  MessageBuilder *this;
  ShaderType in_R8D;
  allocator<char> local_409;
  string local_408;
  MessageBuilder local_3e8;
  string local_268;
  ShaderSource local_248;
  ProgramSources local_220;
  undefined1 local_150 [8];
  ShaderProgram program;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  TestLog *pTStack_20;
  int ndx;
  TestLog *log;
  NegativeTestContext *pNStack_10;
  TestCase testCase_local;
  NegativeTestContext *ctx_local;
  
  log._4_4_ = testCase;
  pNStack_10 = ctx;
  pTStack_20 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
    bVar2 = NegativeTestContext::isShaderSupported
                      (pNStack_10,
                       *(ShaderType *)
                        (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_24 * 4))
    ;
    pNVar1 = pNStack_10;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Verify shader: ",&local_69);
      __rhs = glu::getShaderTypeName
                        (*(ShaderType *)
                          (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_24 * 4
                          ));
      std::operator+(&local_48,&local_68,__rhs);
      NegativeTestContext::beginSection(pNVar1,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      renderCtx = NegativeTestContext::getRenderContext(pNStack_10);
      glu::ProgramSources::ProgramSources(&local_220);
      shaderType_ = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_24 * 4);
      NegativeTestShared::(anonymous_namespace)::genShaderSource_abi_cxx11_
                (&local_268,(_anonymous_namespace_ *)pNStack_10,
                 (NegativeTestContext *)(ulong)log._4_4_,shaderType_,in_R8D);
      glu::ShaderSource::ShaderSource(&local_248,shaderType_,&local_268);
      sources = glu::ProgramSources::operator<<(&local_220,&local_248);
      glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_150,renderCtx,sources);
      glu::ShaderSource::~ShaderSource(&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      glu::ProgramSources::~ProgramSources(&local_220);
      pSVar3 = glu::ShaderProgram::getShaderInfo
                         ((ShaderProgram *)local_150,
                          *(ShaderType *)
                           (NegativeTestShared::(anonymous_namespace)::s_shaders +
                           (long)local_24 * 4),0);
      if ((pSVar3->compileOk & 1U) != 0) {
        glu::operator<<(pTStack_20,(ShaderProgram *)local_150);
        tcu::TestLog::operator<<(&local_3e8,pTStack_20,(BeginMessageToken *)&tcu::TestLog::Message);
        this = tcu::MessageBuilder::operator<<
                         (&local_3e8,
                          (char (*) [50])"Expected program to fail, but compilation passed.");
        tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3e8);
        pNVar1 = pNStack_10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"Shader was not expected to compile.",&local_409);
        NegativeTestContext::fail(pNVar1,&local_408);
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator(&local_409);
      }
      NegativeTestContext::endSection(pNStack_10);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_150);
    }
  }
  return;
}

Assistant:

void iterateShaders (NegativeTestContext& ctx, TestCase testCase)
{
	tcu::TestLog& log = ctx.getLog();
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_shaders); ndx++)
	{
		if (ctx.isShaderSupported(s_shaders[ndx]))
		{
			ctx.beginSection(std::string("Verify shader: ") + glu::getShaderTypeName(s_shaders[ndx]));
			const glu::ShaderProgram program(ctx.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(s_shaders[ndx], genShaderSource(ctx, testCase, s_shaders[ndx])));
			if (program.getShaderInfo(s_shaders[ndx]).compileOk)
			{
				log << program;
				log << tcu::TestLog::Message << "Expected program to fail, but compilation passed." << tcu::TestLog::EndMessage;
				ctx.fail("Shader was not expected to compile.");
			}
			ctx.endSection();
		}
	}
}